

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncsd.c
# Opt level: O2

int ncsd_open(NCSDContext *context,char *filename)

{
  ExHeader *exheader;
  byte bVar1;
  FILE *__stream;
  FILE *__stream_00;
  uint8_t *puVar2;
  int iVar3;
  uint128 key_;
  uint128 local_68;
  uint128 key_y;
  
  __stream_00 = fopen64(filename,"rb");
  if (__stream_00 == (FILE *)0x0) {
    iVar3 = -1;
  }
  else {
    context->fd = __stream_00;
    fread(&context->header,0x200,1,__stream_00);
    if (*(int *)(context->header).magic == 0x4453434e) {
      __stream = (FILE *)context->fd;
      fseeko64(__stream,(ulong)(context->header).partition_geometry[0].offset << 9,0);
      fread(&context->ncch,0x200,1,__stream);
      if (*(int *)(context->ncch).magic == 0x4843434e) {
        exheader = &context->exheader;
        fread(exheader,0x800,1,__stream);
        bVar1 = (context->ncch).flags[7];
        if ((bVar1 & 4) == 0) {
          if ((bVar1 & 1) == 0) {
            local_68.lowpart = 0x24591dc5d52768a;
            local_68.highpart = 0x1ff9e9aac5fe0408;
            key_y.lowpart = *(uint64_t *)(context->ncch).signature;
            key_y.highpart = *(uint64_t *)((context->ncch).signature + 8);
            uint128_bswap(&key_y);
            key_ = slot_0x2C_key;
            uint128_rol(&key_,2);
            uint128_xor(&key_,&key_y);
            uint128_add(&key_,&local_68);
            uint128_rol(&key_,0x57);
            puVar2 = context->calc_key;
            for (iVar3 = 0x38; -1 < iVar3; iVar3 = iVar3 + -8) {
              *puVar2 = (uint8_t)(key_.highpart >> ((byte)iVar3 & 0x3f));
              puVar2 = puVar2 + 1;
            }
            for (iVar3 = 0x38; -1 < iVar3; iVar3 = iVar3 + -8) {
              *puVar2 = (uint8_t)(key_.lowpart >> ((byte)iVar3 & 0x3f));
              puVar2 = puVar2 + 1;
            }
            context->encrypted = 1;
          }
          else {
            context->calc_key[0] = '\0';
            context->calc_key[1] = '\0';
            context->calc_key[2] = '\0';
            context->calc_key[3] = '\0';
            context->calc_key[4] = '\0';
            context->calc_key[5] = '\0';
            context->calc_key[6] = '\0';
            context->calc_key[7] = '\0';
            context->calc_key[8] = '\0';
            context->calc_key[9] = '\0';
            context->calc_key[10] = '\0';
            context->calc_key[0xb] = '\0';
            context->calc_key[0xc] = '\0';
            context->calc_key[0xd] = '\0';
            context->calc_key[0xe] = '\0';
            context->calc_key[0xf] = '\0';
            context->encrypted = 2;
          }
        }
        else {
          context->encrypted = 0;
        }
        ncsd_crypt_exheader(context,exheader);
        ncch_exheader_get_hash(exheader,(uint8_t *)&key_y);
        iVar3 = bcmp(&key_y,(context->ncch).extended_header_hash,0x20);
        if (iVar3 == 0) {
          return 0;
        }
        iVar3 = -4;
      }
      else {
        iVar3 = -3;
      }
      fclose(__stream_00);
    }
    else {
      fclose(__stream_00);
      iVar3 = -2;
    }
  }
  return iVar3;
}

Assistant:

int ncsd_open(NCSDContext *context, const char *filename) {
    FILE *fd = fopen(filename, "rb");
    int result;
    if (fd == NULL) return NCSD_FILE_NOT_FOUND;
    context->fd = fd;
    fread(&context->header, sizeof(NCSDHeader), 1, fd);
    if (memcmp(context->header.magic, "NCSD", 4) != 0) {
        fclose(fd);
        return NCSD_INVALID_NCSD_HEADER;
    }
    result = read_ncch(context);
    if (result != NCSD_OK) {
        fclose(fd);
        return result;
    }
    return NCSD_OK;
}